

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaResub2.c
# Opt level: O1

void Gia_RsbAddSideInputs(Gia_Man_t *p,Vec_Wec_t *vLevels,Vec_Int_t *vWin)

{
  Gia_Obj_t *pGVar1;
  Gia_Obj_t *pGVar2;
  Gia_Obj_t *pGVar3;
  int iVar4;
  int iVar5;
  int *piVar6;
  ulong uVar7;
  uint uVar8;
  int iVar9;
  Vec_Int_t *pVVar10;
  Gia_Obj_t *pGVar11;
  Vec_Int_t *pVVar12;
  long lVar13;
  int iVar14;
  size_t sVar15;
  long lVar16;
  long lVar17;
  int iVar18;
  Gia_Obj_t *pGVar19;
  
  if (0 < (long)vLevels->nSize) {
    lVar13 = 0;
    iVar14 = 0;
    do {
      iVar14 = iVar14 + *(int *)((long)&vLevels->pArray->nSize + lVar13);
      lVar13 = lVar13 + 0x10;
    } while ((long)vLevels->nSize * 0x10 != lVar13);
    if (iVar14 != 0) {
      __assert_fail("Vec_WecSizeSize(vLevels) == 0",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/gia/giaResub2.c"
                    ,0x368,"void Gia_RsbAddSideInputs(Gia_Man_t *, Vec_Wec_t *, Vec_Int_t *)");
    }
  }
  if (0 < vWin->nSize) {
    lVar13 = 0;
    do {
      iVar14 = vWin->pArray[lVar13];
      if (p->nTravIdsAlloc <= iVar14) {
        __assert_fail("Id < p->nTravIdsAlloc",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/gia/gia.h"
                      ,0x268,"int Gia_ObjIsTravIdCurrentId(Gia_Man_t *, int)");
      }
      if (p->pTravIds[iVar14] != p->nTravIds) {
        __assert_fail("Gia_ObjIsTravIdCurrentId(p, iObj)",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/gia/giaResub2.c"
                      ,0x36c,"void Gia_RsbAddSideInputs(Gia_Man_t *, Vec_Wec_t *, Vec_Int_t *)");
      }
      uVar8 = Gia_ObjLevelId(p,iVar14);
      if (vLevels->nSize <= (int)uVar8) {
        iVar4 = uVar8 + 1;
        iVar9 = vLevels->nSize * 2;
        if (iVar9 <= iVar4) {
          iVar9 = iVar4;
        }
        if (vLevels->nCap < iVar9) {
          sVar15 = (long)iVar9 << 4;
          if (vLevels->pArray == (Vec_Int_t *)0x0) {
            pVVar10 = (Vec_Int_t *)malloc(sVar15);
          }
          else {
            pVVar10 = (Vec_Int_t *)realloc(vLevels->pArray,sVar15);
          }
          vLevels->pArray = pVVar10;
          memset(pVVar10 + vLevels->nCap,0,((long)iVar9 - (long)vLevels->nCap) * 0x10);
          vLevels->nCap = iVar9;
        }
        vLevels->nSize = iVar4;
      }
      if (((int)uVar8 < 0) || (vLevels->nSize <= (int)uVar8)) {
LAB_007a5eda:
        __assert_fail("i >= 0 && i < p->nSize",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/vec/vecWec.h"
                      ,0x9c,"Vec_Int_t *Vec_WecEntry(Vec_Wec_t *, int)");
      }
      Vec_IntPush(vLevels->pArray + uVar8,iVar14);
      lVar13 = lVar13 + 1;
    } while (lVar13 < vWin->nSize);
  }
  uVar8 = vLevels->nSize;
  if (0 < (int)uVar8) {
    lVar13 = 0;
    do {
      pVVar10 = vLevels->pArray;
      if (0 < pVVar10[lVar13].nSize) {
        lVar17 = 0;
LAB_007a5ae1:
        iVar14 = pVVar10[lVar13].pArray[lVar17];
        if (((long)iVar14 < 0) || (p->nObjs <= iVar14)) {
LAB_007a5e9c:
          __assert_fail("v >= 0 && v < p->nObjs",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/gia/gia.h"
                        ,0x1d1,"Gia_Obj_t *Gia_ManObj(Gia_Man_t *, int)");
        }
        if (p->pObjs != (Gia_Obj_t *)0x0) {
          pGVar1 = p->pObjs + iVar14;
          pGVar11 = p->pObjs;
          if (pGVar1 < pGVar11) {
LAB_007a5e7d:
            __assert_fail("p->pObjs <= pObj && pObj < p->pObjs + p->nObjs",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/gia/gia.h"
                          ,0x1d9,"int Gia_ObjId(Gia_Man_t *, Gia_Obj_t *)");
          }
          iVar14 = 0;
          do {
            iVar4 = p->nObjs;
            pGVar2 = pGVar11 + iVar4;
            if (pGVar2 <= pGVar1) goto LAB_007a5e7d;
            uVar8 = (int)((long)pGVar1 - (long)pGVar11 >> 2) * -0x55555555;
            if (((int)uVar8 < 0) || (p->vFanoutNums->nSize <= (int)uVar8)) {
LAB_007a5e5e:
              __assert_fail("i >= 0 && i < p->nSize",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/vec/vecInt.h"
                            ,0x1a9,"int Vec_IntEntry(Vec_Int_t *, int)");
            }
            if (p->vFanoutNums->pArray[uVar8 & 0x7fffffff] <= iVar14) goto LAB_007a5e00;
            iVar9 = p->vFanout->nSize;
            if (iVar9 <= (int)uVar8) goto LAB_007a5e5e;
            piVar6 = p->vFanout->pArray;
            uVar8 = piVar6[uVar8 & 0x7fffffff] + iVar14;
            if (((int)uVar8 < 0) || (iVar9 <= (int)uVar8)) goto LAB_007a5e5e;
            iVar9 = piVar6[uVar8];
            lVar16 = (long)iVar9;
            if ((lVar16 < 0) || (iVar4 <= iVar9)) goto LAB_007a5e9c;
            iVar14 = iVar14 + 1;
            if (iVar14 == 6) goto LAB_007a5e00;
            pGVar3 = pGVar11 + lVar16;
            uVar7 = *(ulong *)pGVar3;
            if ((uVar7 & 0x1fffffff) != 0x1fffffff && -1 < (int)uVar7) {
              if (iVar4 <= iVar9) goto LAB_007a5e7d;
              iVar4 = p->nTravIdsAlloc;
              if (iVar4 <= iVar9) {
LAB_007a5ebb:
                __assert_fail("Gia_ObjId(p, pObj) < p->nTravIdsAlloc",
                              "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/gia/gia.h"
                              ,0x264,"int Gia_ObjIsTravIdCurrent(Gia_Man_t *, Gia_Obj_t *)");
              }
              piVar6 = p->pTravIds;
              iVar5 = p->nTravIds;
              if (piVar6[lVar16] != iVar5) {
                pGVar19 = pGVar3 + -(uVar7 & 0x1fffffff);
                if ((pGVar19 < pGVar11) || (pGVar2 <= pGVar19)) goto LAB_007a5e7d;
                iVar18 = (int)((long)pGVar19 - (long)pGVar11 >> 2) * -0x55555555;
                if (iVar4 <= iVar18) goto LAB_007a5ebb;
                if (piVar6[iVar18] == iVar5) {
                  pGVar19 = pGVar3 + -(ulong)((uint)(uVar7 >> 0x20) & 0x1fffffff);
                  if ((pGVar19 < pGVar11) || (pGVar2 <= pGVar19)) goto LAB_007a5e7d;
                  iVar18 = (int)((long)pGVar19 - (long)pGVar11 >> 2) * -0x55555555;
                  if (iVar4 <= iVar18) goto LAB_007a5ebb;
                  if (piVar6[iVar18] == iVar5) {
                    piVar6[lVar16] = iVar5;
                    if (p->nObjs <= iVar9) goto LAB_007a5e7d;
                    uVar8 = Gia_ObjLevelId(p,iVar9);
                    pGVar11 = p->pObjs;
                    if ((pGVar3 < pGVar11) || (pGVar11 + p->nObjs <= pGVar3)) goto LAB_007a5e7d;
                    if (vLevels->nSize <= (int)uVar8) {
                      iVar4 = uVar8 + 1;
                      iVar9 = vLevels->nSize * 2;
                      if (iVar9 <= iVar4) {
                        iVar9 = iVar4;
                      }
                      if (vLevels->nCap < iVar9) {
                        sVar15 = (long)iVar9 << 4;
                        if (vLevels->pArray == (Vec_Int_t *)0x0) {
                          pVVar12 = (Vec_Int_t *)malloc(sVar15);
                        }
                        else {
                          pVVar12 = (Vec_Int_t *)realloc(vLevels->pArray,sVar15);
                        }
                        vLevels->pArray = pVVar12;
                        memset(pVVar12 + vLevels->nCap,0,((long)iVar9 - (long)vLevels->nCap) * 0x10)
                        ;
                        vLevels->nCap = iVar9;
                      }
                      vLevels->nSize = iVar4;
                    }
                    if (((int)uVar8 < 0) || (vLevels->nSize <= (int)uVar8)) goto LAB_007a5eda;
                    Vec_IntPush(vLevels->pArray + uVar8,
                                (int)((ulong)((long)pGVar3 - (long)pGVar11) >> 2) * -0x55555555);
                    pGVar11 = p->pObjs;
                    if ((pGVar3 < pGVar11) || (pGVar11 + p->nObjs <= pGVar3)) goto LAB_007a5e7d;
                    Vec_IntPush(vWin,(int)((ulong)((long)pGVar3 - (long)pGVar11) >> 2) * -0x55555555
                               );
                  }
                }
              }
            }
            pGVar11 = p->pObjs;
            if (pGVar1 < pGVar11) goto LAB_007a5e7d;
          } while( true );
        }
      }
LAB_007a5e1a:
      lVar13 = lVar13 + 1;
      uVar8 = vLevels->nSize;
    } while (lVar13 < (int)uVar8);
  }
  if (0 < (int)uVar8) {
    pVVar10 = vLevels->pArray;
    lVar13 = 0;
    do {
      *(undefined4 *)((long)&pVVar10->nSize + lVar13) = 0;
      lVar13 = lVar13 + 0x10;
    } while ((ulong)uVar8 << 4 != lVar13);
  }
  return;
LAB_007a5e00:
  lVar17 = lVar17 + 1;
  if (pVVar10[lVar13].nSize <= lVar17) goto LAB_007a5e1a;
  goto LAB_007a5ae1;
}

Assistant:

void Gia_RsbAddSideInputs( Gia_Man_t * p, Vec_Wec_t * vLevels, Vec_Int_t * vWin )
{
    Vec_Int_t * vLevel; 
    Gia_Obj_t * pObj, * pFanout;
    int k, i, f, iObj;
    // precondition: the levelized structure is empty
    assert( Vec_WecSizeSize(vLevels) == 0 );
    // precondition: window nodes are labeled with the current ID
    Vec_IntForEachEntry( vWin, iObj, i )
    {
        assert( Gia_ObjIsTravIdCurrentId(p, iObj) );
        Vec_WecPush( vLevels, Gia_ObjLevelId(p, iObj), iObj );
    }
    // iterate through all objects and explore their fanouts
    Vec_WecForEachLevel( vLevels, vLevel, k )
        Gia_ManForEachObjVec( vLevel, p, pObj, i )
            Gia_ObjForEachFanoutStatic( p, pObj, pFanout, f )
            {
                if ( f == 5 ) // explore first 5 fanouts of the node
                    break;
                if ( Gia_ObjIsAnd(pFanout) && // internal node
                    !Gia_ObjIsTravIdCurrent(p, pFanout) && // not in the window
                     Gia_ObjIsTravIdCurrent(p, Gia_ObjFanin0(pFanout)) && // but fanins are
                     Gia_ObjIsTravIdCurrent(p, Gia_ObjFanin1(pFanout)) )  // in the window
                {
                    // add fanout to the window and to the levelized structure
                    Gia_ObjSetTravIdCurrent( p, pFanout );
                    Vec_WecPush( vLevels, Gia_ObjLevel(p, pFanout), Gia_ObjId(p, pFanout) );
                    Vec_IntPush( vWin, Gia_ObjId(p, pFanout) );
                }
            }
    // iterate through the nodes in the levelized structure
    Vec_WecForEachLevel( vLevels, vLevel, k )
        Vec_IntClear( vLevel );
}